

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O0

uint64_t search_one(int *lev,int nb_strengths,uint64_t (*mse) [64],int sb_count,
                   CDEF_PICK_METHOD pick_method)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  uint64_t best;
  uint64_t best_mse;
  int gi;
  int best_id;
  uint64_t best_tot_mse;
  int j;
  int i;
  int total_strengths;
  uint64_t tot_mse [64];
  ulong local_258;
  ulong local_250;
  int local_248;
  int local_244;
  ulong local_240;
  int local_234;
  int local_230;
  ulong local_228 [65];
  int local_1c;
  long local_18;
  int local_c;
  long local_8;
  
  iVar1 = nb_cdef_strengths[in_R8D];
  local_240 = 0x8000000000000000;
  local_244 = 0;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(local_228,0,0x200);
  for (local_230 = 0; local_230 < local_1c; local_230 = local_230 + 1) {
    local_250 = 0x8000000000000000;
    for (local_248 = 0; local_248 < local_c; local_248 = local_248 + 1) {
      if (*(ulong *)(local_18 + (long)local_230 * 0x200 +
                    (long)*(int *)(local_8 + (long)local_248 * 4) * 8) < local_250) {
        local_250 = *(ulong *)(local_18 + (long)local_230 * 0x200 +
                              (long)*(int *)(local_8 + (long)local_248 * 4) * 8);
      }
    }
    for (local_234 = 0; local_234 < iVar1; local_234 = local_234 + 1) {
      local_258 = local_250;
      if (*(ulong *)(local_18 + (long)local_230 * 0x200 + (long)local_234 * 8) < local_250) {
        local_258 = *(ulong *)(local_18 + (long)local_230 * 0x200 + (long)local_234 * 8);
      }
      local_228[local_234] = local_258 + local_228[local_234];
    }
  }
  for (local_234 = 0; local_234 < iVar1; local_234 = local_234 + 1) {
    if (local_228[local_234] < local_240) {
      local_240 = local_228[local_234];
      local_244 = local_234;
    }
  }
  *(int *)(local_8 + (long)local_c * 4) = local_244;
  return local_240;
}

Assistant:

static uint64_t search_one(int *lev, int nb_strengths,
                           uint64_t mse[][TOTAL_STRENGTHS], int sb_count,
                           CDEF_PICK_METHOD pick_method) {
  uint64_t tot_mse[TOTAL_STRENGTHS];
  const int total_strengths = nb_cdef_strengths[pick_method];
  int i, j;
  uint64_t best_tot_mse = (uint64_t)1 << 63;
  int best_id = 0;
  memset(tot_mse, 0, sizeof(tot_mse));
  for (i = 0; i < sb_count; i++) {
    int gi;
    uint64_t best_mse = (uint64_t)1 << 63;
    /* Find best mse among already selected options. */
    for (gi = 0; gi < nb_strengths; gi++) {
      if (mse[i][lev[gi]] < best_mse) {
        best_mse = mse[i][lev[gi]];
      }
    }
    /* Find best mse when adding each possible new option. */
    for (j = 0; j < total_strengths; j++) {
      uint64_t best = best_mse;
      if (mse[i][j] < best) best = mse[i][j];
      tot_mse[j] += best;
    }
  }
  for (j = 0; j < total_strengths; j++) {
    if (tot_mse[j] < best_tot_mse) {
      best_tot_mse = tot_mse[j];
      best_id = j;
    }
  }
  lev[nb_strengths] = best_id;
  return best_tot_mse;
}